

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

void If_ManImproveMark_rec(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  int iVar1;
  If_Obj_t *pIVar2;
  Vec_Ptr_t *vVisited_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  if ((*(uint *)pObj >> 8 & 1) == 0) {
    iVar1 = If_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("If_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                    ,0xba,"void If_ManImproveMark_rec(If_Man_t *, If_Obj_t *, Vec_Ptr_t *)");
    }
    pIVar2 = If_ObjFanin0(pObj);
    If_ManImproveMark_rec(p,pIVar2,vVisited);
    pIVar2 = If_ObjFanin1(pObj);
    If_ManImproveMark_rec(p,pIVar2,vVisited);
    Vec_PtrPush(vVisited,pObj);
    *(uint *)pObj = *(uint *)pObj & 0xfffffeff | 0x100;
  }
  return;
}

Assistant:

void If_ManImproveMark_rec( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( pObj->fMark )
        return;
    assert( If_ObjIsAnd(pObj) );
    If_ManImproveMark_rec( p, If_ObjFanin0(pObj), vVisited );
    If_ManImproveMark_rec( p, If_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
    pObj->fMark = 1;
}